

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

bool __thiscall
FxStructMember::RequestAddress(FxStructMember *this,FCompileContext *ctx,bool *writable)

{
  uint uVar1;
  PType *pPVar2;
  PClass *pPVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  bool bVar7;
  PClass *pPVar6;
  
  uVar1 = this->membervar->Flags;
  if (((uVar1 >> 0xd & 1) != 0) || (this->AddressRequested = true, writable == (bool *)0x0))
  goto LAB_00530913;
  if (this->AddressWritable == true) {
    if ((uVar1 & 0x10) != 0) {
      if ((uVar1 >> 0xe & 1) != 0) {
        iVar5 = FWadCollection::GetLumpFile(&Wads,ctx->Lump);
        if (iVar5 == 0) goto LAB_00530887;
      }
      goto LAB_0053090f;
    }
LAB_00530887:
    pPVar3 = PPointer::RegistrationInfo.MyClass;
    pPVar2 = this->classx->ValueType;
    pPVar6 = (pPVar2->super_PTypeBase).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar5 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
      (pPVar2->super_PTypeBase).super_DObject.Class = pPVar6;
    }
    bVar7 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar3 && bVar7) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar7 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    bVar4 = true;
    if (bVar7) {
      bVar4 = *(byte *)&this->classx->ValueType[1].super_PTypeBase.super_DObject.Class ^ 1;
    }
  }
  else {
LAB_0053090f:
    bVar4 = false;
  }
  *writable = (bool)bVar4;
LAB_00530913:
  return (uVar1 >> 0xd & 1) == 0;
}

Assistant:

bool FxStructMember::RequestAddress(FCompileContext &ctx, bool *writable)
{
	// Cannot take the address of metadata variables.
	if (membervar->Flags & VARF_Static)
	{
		return false;
	}
	AddressRequested = true;
	if (writable != nullptr) *writable = (AddressWritable && !ctx.CheckReadOnly(membervar->Flags) &&
											(!classx->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) || !static_cast<PPointer*>(classx->ValueType)->IsConst));
	return true;
}